

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_optimization.cc
# Opt level: O3

void __thiscall QPDF::filterCompressedObjects(QPDF *this,ObjTable *obj)

{
  _Rb_tree_header *p_Var1;
  key_type *__k;
  QPDF *pQVar2;
  ulong uVar3;
  Object *pOVar4;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  *this_00;
  _Base_ptr p_Var5;
  _Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
  *this_01;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree<QPDF::ObjUser,QPDF::ObjUser,std::_Identity<QPDF::ObjUser>,std::less<QPDF::ObjUser>,std::allocator<QPDF::ObjUser>>
  *p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  ulong uVar10;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var11;
  map<QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>_>
  t_object_to_obj_users;
  map<QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
  t_obj_user_to_objects;
  QPDFObjGen local_b0;
  _Base_ptr local_a8;
  _Base_ptr local_a0;
  QPDF *local_98;
  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>_>
  local_90;
  _Rb_tree<QPDF::ObjUser,_std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>,_std::_Select1st<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
  local_60;
  
  if (obj->streams_empty == false) {
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_90._M_impl.super__Rb_tree_header._M_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Var11._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    local_a0 = *(_Base_ptr *)((long)&(_Var11._M_head_impl)->obj_user_to_objects + 0x18);
    local_a8 = (_Base_ptr)((long)&(_Var11._M_head_impl)->obj_user_to_objects + 8);
    local_98 = this;
    local_90._M_impl.super__Rb_tree_header._M_header._M_right =
         local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (local_a0 != local_a8) {
      p_Var1 = &(obj->super_ObjTable<QPDFWriter::Object>).sparse_elements._M_t._M_impl.
                super__Rb_tree_header;
      do {
        p_Var6 = *(_Rb_tree_node_base **)(local_a0 + 3);
        p_Var8 = local_a0 + 2;
        if (p_Var6 != (_Rb_tree_node_base *)&p_Var8->_M_left) {
          __k = (key_type *)(local_a0 + 1);
          do {
            uVar10 = (ulong)(int)p_Var6[1]._M_color;
            uVar3 = ((long)(obj->super_ObjTable<QPDFWriter::Object>).
                           super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                           super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(obj->super_ObjTable<QPDFWriter::Object>).
                           super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                           super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
            if (uVar3 < uVar10 || uVar3 - uVar10 == 0) {
              p_Var5 = (obj->super_ObjTable<QPDFWriter::Object>).sparse_elements._M_t._M_impl.
                       super__Rb_tree_header._M_header._M_parent;
              p_Var9 = &p_Var1->_M_header;
              if (p_Var5 != (_Base_ptr)0x0) {
                do {
                  if (*(ulong *)(p_Var5 + 1) >= uVar10) {
                    p_Var9 = p_Var5;
                  }
                  p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < uVar10];
                } while (p_Var5 != (_Base_ptr)0x0);
                if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
                   (((_Rb_tree_header *)p_Var9)->_M_node_count <= uVar10)) goto LAB_00236fbe;
              }
            }
            else {
LAB_00236fbe:
              pOVar4 = ObjTable<QPDFWriter::Object>::element
                                 (&obj->super_ObjTable<QPDFWriter::Object>,uVar10);
              if (pOVar4->object_stream < 1) {
                this_01 = (_Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
                           *)std::
                             map<QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                             ::operator[]((map<QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                                           *)&local_60,__k);
                std::
                _Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
                ::_M_insert_unique<QPDFObjGen_const&>(this_01,(QPDFObjGen *)(p_Var6 + 1));
              }
              else {
                this_00 = &std::
                           map<QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                           ::operator[]((map<QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                                         *)&local_60,__k)->_M_t;
                local_b0.obj = pOVar4->object_stream;
                local_b0.gen = 0;
                std::
                _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                ::_M_insert_unique<QPDFObjGen>(this_00,&local_b0);
              }
            }
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
          } while (p_Var6 != (_Rb_tree_node_base *)&p_Var8->_M_left);
        }
        local_a0 = (_Base_ptr)std::_Rb_tree_increment(local_a0);
      } while (local_a0 != local_a8);
      _Var11._M_head_impl =
           (local_98->m)._M_t.
           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    }
    p_Var8 = *(_Base_ptr *)((long)&((_Var11._M_head_impl)->object_to_obj_users)._M_t._M_impl + 0x18)
    ;
    local_a0 = (_Base_ptr)((long)&((_Var11._M_head_impl)->object_to_obj_users)._M_t._M_impl + 8);
    if (p_Var8 != local_a0) {
      local_a8 = &(obj->super_ObjTable<QPDFWriter::Object>).sparse_elements._M_t._M_impl.
                  super__Rb_tree_header._M_header;
      do {
        uVar3 = (ulong)(int)p_Var8[1]._M_color;
        uVar10 = ((long)(obj->super_ObjTable<QPDFWriter::Object>).
                        super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                        super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(obj->super_ObjTable<QPDFWriter::Object>).
                        super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                        super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
        if (uVar10 < uVar3 || uVar10 - uVar3 == 0) {
          p_Var5 = (obj->super_ObjTable<QPDFWriter::Object>).sparse_elements._M_t._M_impl.
                   super__Rb_tree_header._M_header._M_parent;
          p_Var9 = local_a8;
          if (p_Var5 != (_Base_ptr)0x0) {
            do {
              if (*(ulong *)(p_Var5 + 1) >= uVar3) {
                p_Var9 = p_Var5;
              }
              p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < uVar3];
            } while (p_Var5 != (_Base_ptr)0x0);
            if ((p_Var9 != local_a8) && (*(ulong *)(p_Var9 + 1) <= uVar3)) goto LAB_002370bc;
          }
        }
        else {
LAB_002370bc:
          p_Var6 = *(_Rb_tree_node_base **)(p_Var8 + 2);
          if (p_Var6 != (_Rb_tree_node_base *)&p_Var8[1]._M_left) {
            do {
              pOVar4 = ObjTable<QPDFWriter::Object>::element
                                 (&obj->super_ObjTable<QPDFWriter::Object>,
                                  (long)(int)p_Var8[1]._M_color);
              if (pOVar4->object_stream < 1) {
                p_Var7 = (_Rb_tree<QPDF::ObjUser,QPDF::ObjUser,std::_Identity<QPDF::ObjUser>,std::less<QPDF::ObjUser>,std::allocator<QPDF::ObjUser>>
                          *)std::
                            map<QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>_>
                            ::operator[]((map<QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>_>
                                          *)&local_90,(key_type *)(p_Var8 + 1));
                std::
                _Rb_tree<QPDF::ObjUser,QPDF::ObjUser,std::_Identity<QPDF::ObjUser>,std::less<QPDF::ObjUser>,std::allocator<QPDF::ObjUser>>
                ::_M_insert_unique<QPDF::ObjUser_const&>(p_Var7,(ObjUser *)(p_Var6 + 1));
              }
              else {
                local_b0.gen = 0;
                local_b0.obj = pOVar4->object_stream;
                p_Var7 = (_Rb_tree<QPDF::ObjUser,QPDF::ObjUser,std::_Identity<QPDF::ObjUser>,std::less<QPDF::ObjUser>,std::allocator<QPDF::ObjUser>>
                          *)std::
                            map<QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>_>
                            ::operator[]((map<QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>_>
                                          *)&local_90,&local_b0);
                std::
                _Rb_tree<QPDF::ObjUser,QPDF::ObjUser,std::_Identity<QPDF::ObjUser>,std::less<QPDF::ObjUser>,std::allocator<QPDF::ObjUser>>
                ::_M_insert_unique<QPDF::ObjUser_const&>(p_Var7,(ObjUser *)(p_Var6 + 1));
              }
              p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
            } while (p_Var6 != (_Rb_tree_node_base *)&p_Var8[1]._M_left);
          }
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while (p_Var8 != local_a0);
      _Var11._M_head_impl =
           (local_98->m)._M_t.
           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    }
    pQVar2 = local_98;
    std::
    _Rb_tree<QPDF::ObjUser,_std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>,_std::_Select1st<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
    ::operator=(&((_Var11._M_head_impl)->obj_user_to_objects)._M_t,&local_60);
    std::
    _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>_>
    ::operator=(&(((pQVar2->m)._M_t.
                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                   super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->object_to_obj_users)
                 ._M_t,&local_90);
    std::
    _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>_>
    ::~_Rb_tree(&local_90);
    std::
    _Rb_tree<QPDF::ObjUser,_std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>,_std::_Select1st<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
    ::~_Rb_tree(&local_60);
  }
  return;
}

Assistant:

void
QPDF::filterCompressedObjects(QPDFWriter::ObjTable const& obj)
{
    if (obj.getStreamsEmpty()) {
        return;
    }

    // Transform object_to_obj_users and obj_user_to_objects so that they refer only to uncompressed
    // objects.  If something is a user of a compressed object, then it is really a user of the
    // object stream that contains it.

    std::map<ObjUser, std::set<QPDFObjGen>> t_obj_user_to_objects;
    std::map<QPDFObjGen, std::set<ObjUser>> t_object_to_obj_users;

    for (auto const& i1: m->obj_user_to_objects) {
        ObjUser const& ou = i1.first;
        // Loop over objects.
        for (auto const& og: i1.second) {
            if (obj.contains(og)) {
                if (auto const& i2 = obj[og].object_stream; i2 <= 0) {
                    t_obj_user_to_objects[ou].insert(og);
                } else {
                    t_obj_user_to_objects[ou].insert(QPDFObjGen(i2, 0));
                }
            }
        }
    }

    for (auto const& i1: m->object_to_obj_users) {
        QPDFObjGen const& og = i1.first;
        if (obj.contains(og)) {
            // Loop over obj_users.
            for (auto const& ou: i1.second) {
                if (auto i2 = obj[og].object_stream; i2 <= 0) {
                    t_object_to_obj_users[og].insert(ou);
                } else {
                    t_object_to_obj_users[QPDFObjGen(i2, 0)].insert(ou);
                }
            }
        }
    }

    m->obj_user_to_objects = t_obj_user_to_objects;
    m->object_to_obj_users = t_object_to_obj_users;
}